

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::GetProperty
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyId PVar2;
  BOOL BVar3;
  PropertyRecord *this_00;
  RecyclableObject *pRVar4;
  ScriptContext *this_01;
  ScriptContext *scriptContext;
  uint32 indexVal;
  int i;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_28;
  PropertyId propertyId_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  scriptContext._4_4_ = 0;
  _indexVal = info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_28 = originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)this;
  while( true ) {
    if (this->propertyCount <= scriptContext._4_4_) {
      this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)originalInstance_local);
      bVar1 = DynamicObject::HasObjectArray((DynamicObject *)originalInstance_local);
      if ((bVar1) &&
         (BVar3 = ScriptContext::IsNumericPropertyId
                            (this_01,value_local._4_4_,(uint32 *)&scriptContext), BVar3 != 0)) {
        this_local._4_4_ =
             DynamicTypeHandler::GetItem
                       (&this->super_DynamicTypeHandler,(DynamicObject *)originalInstance_local,
                        pvStack_28,(uint32)scriptContext,&info_local->m_instance,this_01);
      }
      else {
        pRVar4 = ScriptContext::GetMissingPropertyResult(requestContext);
        info_local->m_instance = pRVar4;
        this_local._4_4_ = 0;
      }
      return this_local._4_4_;
    }
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[scriptContext._4_4_].Id);
    PVar2 = PropertyRecord::GetPropertyId(this_00);
    if (PVar2 == value_local._4_4_) break;
    scriptContext._4_4_ = scriptContext._4_4_ + 1;
  }
  if ((this->descriptors[scriptContext._4_4_].field_1.Attributes & 8) != 0) {
    pRVar4 = ScriptContext::GetMissingPropertyResult(requestContext);
    info_local->m_instance = pRVar4;
    return 0;
  }
  pRVar4 = (RecyclableObject *)
           DynamicObject::GetSlot((DynamicObject *)originalInstance_local,scriptContext._4_4_);
  info_local->m_instance = pRVar4;
  PropertyValueInfo::Set
            (_indexVal,(RecyclableObject *)originalInstance_local,(PropertyIndex)scriptContext._4_4_
             ,this->descriptors[scriptContext._4_4_].field_1.Attributes,InlineCacheNoFlags);
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    *value = requestContext->GetMissingPropertyResult();
                    return false;
                }
                *value = instance->GetSlot(i);
                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItem(instance, originalInstance, indexVal, value, scriptContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }